

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_iarchive.h
# Opt level: O0

void __thiscall serialization::json_iarchive::load(json_iarchive *this,int *v)

{
  bool bVar1;
  int iVar2;
  reference ppGVar3;
  int *v_local;
  json_iarchive *this_local;
  
  bVar1 = std::
          stack<const_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_*,_std::deque<const_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_*,_std::allocator<const_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_*>_>_>
          ::empty(&this->stack_);
  if (!bVar1) {
    ppGVar3 = std::
              stack<const_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_*,_std::deque<const_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_*,_std::allocator<const_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_*>_>_>
              ::top(&this->stack_);
    bVar1 = rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::IsInt(*ppGVar3);
    if (bVar1) goto LAB_0013fef1;
  }
  throw_serialization_error("json","expect int");
LAB_0013fef1:
  ppGVar3 = std::
            stack<const_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_*,_std::deque<const_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_*,_std::allocator<const_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_*>_>_>
            ::top(&this->stack_);
  iVar2 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::GetInt(*ppGVar3);
  *v = iVar2;
  return;
}

Assistant:

void load(int & v) const
    {
        if(stack_.empty() || (!stack_.top()->IsInt()))
            throw_serialization_error("json", "expect int");
        v = stack_.top()->GetInt();
    }